

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void __thiscall
RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredFunction *this,RegVmLoweredBlock *lowBlock)

{
  SmallArray<unsigned_char,_16U> *this_00;
  RegVmLoweredInstruction *pRVar1;
  bool bVar2;
  uchar *puVar3;
  uint index;
  
  this_00 = &this->delayedFreedRegisters;
  index = 0;
  while( true ) {
    if ((this->delayedFreedRegisters).count <= index) {
      (this->delayedFreedRegisters).count = 0;
      return;
    }
    if (lowBlock == (RegVmLoweredBlock *)0x0) {
      puVar3 = SmallArray<unsigned_char,_16U>::operator[](this_00,index);
      SmallArray<unsigned_char,_16U>::push_back(&this->killedRegisters,puVar3);
    }
    else {
      pRVar1 = lowBlock->lastInstruction;
      puVar3 = SmallArray<unsigned_char,_16U>::operator[](this_00,index);
      SmallArray<unsigned_char,_8U>::push_back(&pRVar1->postKillRegisters,puVar3);
    }
    puVar3 = SmallArray<unsigned_char,_16U>::operator[](this_00,index);
    bVar2 = SmallArray<unsigned_char,_16U>::contains(&this->freedRegisters,puVar3);
    if (bVar2) break;
    puVar3 = SmallArray<unsigned_char,_16U>::operator[](this_00,index);
    SmallArray<unsigned_char,_16U>::push_back(&this->freedRegisters,puVar3);
    index = index + 1;
  }
  __assert_fail("!freedRegisters.contains(delayedFreedRegisters[i])",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0xd8,"void RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredBlock *)");
}

Assistant:

void RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredBlock *lowBlock)
{
	for(unsigned i = 0; i < delayedFreedRegisters.size(); i++)
	{
		if(lowBlock)
			lowBlock->lastInstruction->postKillRegisters.push_back(delayedFreedRegisters[i]);
		else
			killedRegisters.push_back(delayedFreedRegisters[i]);

		assert(!freedRegisters.contains(delayedFreedRegisters[i]));
		freedRegisters.push_back(delayedFreedRegisters[i]);
	}

	delayedFreedRegisters.clear();
}